

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError ReadStream(PaStream *s,void *buffer,unsigned_long frames)

{
  int iVar1;
  int iVar2;
  unsigned_long numFrames;
  pthread_t pVar3;
  char *pcVar4;
  void *__dest;
  long lVar5;
  PaError PVar6;
  int xrun;
  undefined8 local_58;
  unsigned_long framesGot;
  PaError local_44;
  void *local_40;
  unsigned_long framesAvail;
  
  lVar5 = *(long *)((long)s + 0x2c0);
  local_58 = *(undefined8 *)((long)s + 0x340);
  if (lVar5 == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->capture.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4495\n"
                     );
    local_44 = -0x26f7;
  }
  else {
    *(undefined8 *)((long)s + 0x340) = 0;
    PVar6 = 0;
    if (0.0 < *(double *)((long)s + 0x280)) {
      *(undefined8 *)((long)s + 0x280) = 0;
      PVar6 = -0x26fd;
    }
    __dest = buffer;
    if (*(int *)((long)s + 0x298) == 0) {
      __dest = *(void **)((long)s + 0x2e8);
      memcpy(__dest,buffer,(long)*(int *)((long)s + 0x290) << 3);
      lVar5 = *(long *)((long)s + 0x2c0);
    }
    local_40 = __dest;
    iVar1 = snd_pcm_state(lVar5);
    if ((iVar1 != 2) || (iVar1 = snd_pcm_start(*(undefined8 *)((long)s + 0x2c0)), -1 < iVar1)) {
      local_44 = PVar6;
LAB_0010e390:
      if (frames == 0) goto LAB_0010e462;
      xrun = 0;
      paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)s,&framesAvail,&xrun);
      if (paUtilErr_ < 0) {
        pcVar4 = 
        "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4526\n"
        ;
      }
      else {
        if (xrun != 0) {
          iVar1 = snd_pcm_state(*(undefined8 *)((long)s + 0x2c0));
          if ((iVar1 != 2) || (iVar1 = snd_pcm_start(*(undefined8 *)((long)s + 0x2c0)), -1 < iVar1))
          goto LAB_0010e390;
          pVar3 = pthread_self();
          iVar2 = pthread_equal(pVar3,paUnixMainThread);
          if (iVar2 != 0) {
            pcVar4 = (char *)snd_strerror(iVar1);
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
          }
          PaUtil_DebugPrint(
                           "Expression \'snd_pcm_start( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4538\n"
                           );
          local_44 = -9999;
          goto LAB_0010e462;
        }
        framesGot = framesAvail;
        if (frames <= framesAvail) {
          framesGot = frames;
        }
        paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)s,&framesGot,&xrun);
        if (paUtilErr_ < 0) {
          pcVar4 = 
          "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4545\n"
          ;
          goto LAB_0010e4db;
        }
        if (framesGot == 0) goto LAB_0010e390;
        numFrames = PaUtil_CopyInput((PaUtilBufferProcessor *)((long)s + 0x68),&local_40,framesGot);
        framesGot = numFrames;
        paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)s,numFrames,&xrun);
        if (-1 < paUtilErr_) {
          frames = frames - numFrames;
          goto LAB_0010e390;
        }
        pcVar4 = 
        "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4549\n"
        ;
      }
LAB_0010e4db:
      PaUtil_DebugPrint(pcVar4);
      local_44 = paUtilErr_;
      goto LAB_0010e462;
    }
    pVar3 = pthread_self();
    iVar2 = pthread_equal(pVar3,paUnixMainThread);
    if (iVar2 != 0) {
      pcVar4 = (char *)snd_strerror(iVar1);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_start( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4520\n"
                     );
    local_44 = -9999;
  }
LAB_0010e462:
  *(undefined8 *)((long)s + 0x340) = local_58;
  return local_44;
}

Assistant:

static PaError ReadStream( PaStream* s, void *buffer, unsigned long frames )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    unsigned long framesGot, framesAvail;
    void *userBuffer;
    snd_pcm_t *save = stream->playback.pcm;

    assert( stream );

    PA_UNLESS( stream->capture.pcm, paCanNotReadFromAnOutputOnlyStream );

    /* Disregard playback */
    stream->playback.pcm = NULL;

    if( stream->overrun > 0. )
    {
        result = paInputOverflowed;
        stream->overrun = 0.0;
    }

    if( stream->capture.userInterleaved )
    {
        userBuffer = buffer;
    }
    else
    {
        /* Copy channels into local array */
        userBuffer = stream->capture.userBuffers;
        memcpy( userBuffer, buffer, sizeof (void *) * stream->capture.numUserChannels );
    }

    /* Start stream if in prepared state */
    if( alsa_snd_pcm_state( stream->capture.pcm ) == SND_PCM_STATE_PREPARED )
    {
        ENSURE_( alsa_snd_pcm_start( stream->capture.pcm ), paUnanticipatedHostError );
    }

    while( frames > 0 )
    {
        int xrun = 0;
        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        /*
        * In case of overrun WaitForFrames leaves the capture stream in STATE_PREPARED
        * most of the time. handleXrun() restarts the ALSA stream only in case
        * snd_pcm_recover() fails, which usually does not happen.
        * Here we start the pcm stream again and go for another try. Another
        * option is: set result to paOverrun and return to caller. Then
        * the caller needs to call ReadStream again. This takes more time and
        * we lose even more frames.
        */
        if (xrun) { /* wd-xxx */
            if( snd_pcm_state( stream->capture.pcm ) == SND_PCM_STATE_PREPARED ) {
                ENSURE_( snd_pcm_start( stream->capture.pcm ), paUnanticipatedHostError );
            }
            continue;
        }

        framesGot = PA_MIN( framesAvail, frames );

        PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
        if( framesGot > 0 )
        {
            framesGot = PaUtil_CopyInput( &stream->bufferProcessor, &userBuffer, framesGot );
            PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            frames -= framesGot;
        }
    }

end:
    stream->playback.pcm = save;
    return result;
error:
    goto end;
}